

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O1

int __thiscall
QUtil::call_main_from_wmain
          (QUtil *this,int argc,wchar_t **argv,function<int_(int,_char_**)> *realmain)

{
  int iVar1;
  _Any_data _Stack_38;
  _Manager_type local_28;
  
  std::function<int_(int,_char_**)>::function
            ((function<int_(int,_char_**)> *)&_Stack_38,(function<int_(int,_char_**)> *)argv);
  iVar1 = ::call_main_from_wmain(SUB81(this,0),argc,(wchar_t **)&_Stack_38,realmain);
  if (local_28 != (code *)0x0) {
    (*local_28)(&_Stack_38,&_Stack_38,__destroy_functor);
  }
  return iVar1;
}

Assistant:

int
QUtil::call_main_from_wmain(int argc, wchar_t* argv[], std::function<int(int, char*[])> realmain)
{
    return ::call_main_from_wmain(true, argc, argv, realmain);
}